

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

SPIRExtension * __thiscall
diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::
allocate<diligent_spirv_cross::SPIRExtension::Extension&>
          (ObjectPool<diligent_spirv_cross::SPIRExtension> *this,Extension *p)

{
  Vector<diligent_spirv_cross::SPIRExtension_*> *this_00;
  Extension EVar1;
  size_t sVar2;
  _Tuple_impl<0UL,_diligent_spirv_cross::SPIRExtension_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
  _Var3;
  _Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false> _Var4;
  ulong count;
  SPIRExtension *pSVar5;
  
  this_00 = &this->vacants;
  if ((this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.buffer_size == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>._M_head_impl =
         (_Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>)malloc(count << 4);
    if (_Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>._M_head_impl !=
        (SPIRExtension *)0x0) {
      SmallVector<diligent_spirv_cross::SPIRExtension_*,_0UL>::reserve(this_00,count);
      _Var4._M_head_impl =
           (SPIRExtension *)
           _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>._M_head_impl;
      for (; count != 0; count = count - 1) {
        SmallVector<diligent_spirv_cross::SPIRExtension_*,_0UL>::reserve
                  (this_00,(this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.
                           buffer_size + 1);
        sVar2 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.buffer_size;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.ptr[sVar2] =
             _Var4._M_head_impl;
        (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.buffer_size =
             sVar2 + 1;
        _Var4._M_head_impl = _Var4._M_head_impl + 1;
      }
      SmallVector<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>,_8UL>
      ::reserve(&this->memory,
                (this->memory).
                super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
                .buffer_size + 1);
      sVar2 = (this->memory).
              super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
              .buffer_size;
      (this->memory).
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
      .ptr[sVar2]._M_t.
      super___uniq_ptr_impl<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
      ._M_t.
      super__Tuple_impl<0UL,_diligent_spirv_cross::SPIRExtension_*,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>
      .super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false> =
           _Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>._M_head_impl;
      (this->memory).
      super_VectorView<std::unique_ptr<diligent_spirv_cross::SPIRExtension,_diligent_spirv_cross::ObjectPool<diligent_spirv_cross::SPIRExtension>::MallocDeleter>_>
      .buffer_size = sVar2 + 1;
      if (_Var3.super__Head_base<0UL,_diligent_spirv_cross::SPIRExtension_*,_false>._M_head_impl !=
          (SPIRExtension *)0x0) goto LAB_00342da2;
    }
    pSVar5 = (SPIRExtension *)0x0;
  }
  else {
LAB_00342da2:
    sVar2 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.buffer_size;
    pSVar5 = (this->vacants).super_VectorView<diligent_spirv_cross::SPIRExtension_*>.ptr[sVar2 - 1];
    if (sVar2 != 0) {
      SmallVector<diligent_spirv_cross::SPIRExtension_*,_0UL>::resize(this_00,sVar2 - 1);
    }
    EVar1 = *p;
    (pSVar5->super_IVariant).self.id = 0;
    (pSVar5->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_0093a790;
    *(Extension *)&(pSVar5->super_IVariant).field_0xc = EVar1;
  }
  return pSVar5;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}